

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O1

void __thiscall
webfront::http::std::experimental::net::v1::detail::
op_queue<std::experimental::net::v1::detail::scheduler_operation>::~op_queue
          (op_queue<std::experimental::net::v1::detail::scheduler_operation> *this)

{
  scheduler_operation *psVar1;
  scheduler_operation *psVar2;
  func_type p_Var3;
  scheduler_operation *tmp;
  error_code local_30;
  
  do {
    psVar1 = this->front_;
    if (psVar1 == (scheduler_operation *)0x0) {
      return;
    }
    psVar2 = psVar1->next_;
    this->front_ = psVar2;
    if (psVar2 == (scheduler_operation *)0x0) {
      this->back_ = (scheduler_operation *)0x0;
    }
    psVar1->next_ = (scheduler_operation *)0x0;
    p_Var3 = psVar1->func_;
    local_30._M_value = 0;
    local_30._M_cat = (error_category *)::std::_V2::system_category();
    (*p_Var3)((void *)0x0,psVar1,&local_30,0);
  } while (psVar1 != (scheduler_operation *)0x0);
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }